

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

type * __thiscall
nonsugar::
parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
          (type *__return_storage_ptr__,nonsugar *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *command,argument_order order)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pbVar1;
  bool bVar2;
  __type_conflict _Var3;
  reference pbVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  size_type sVar6;
  ostream *poVar7;
  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  const_reference pvVar8;
  reference pcVar9;
  reference __rhs;
  char *s;
  char *s_00;
  char *s_01;
  undefined1 auVar10 [16];
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  anon_class_32_4_8456e227 local_5d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b0;
  iterator argument_last;
  iterator argument_it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_580;
  const_iterator local_578;
  anon_class_64_8_a8713554 local_570;
  undefined1 local_529;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  anon_class_24_3_a5fc596c local_4c8;
  bool local_4aa;
  char local_4a9;
  bool exact_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_4a8;
  char name_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_480;
  anon_class_64_8_d948d99e local_460;
  undefined1 local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  bool local_3f1;
  reference local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *long_name;
  iterator __end0;
  iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  stringstream local_3c8 [7];
  bool first;
  sstream<string_type> ss;
  ostream local_3b8 [383];
  undefined1 local_239;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  anon_class_32_4_971d7071 local_1d8;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partial_matches;
  undefined1 local_198 [7];
  bool exact;
  string_type name;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_158;
  undefined1 local_138 [8];
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  match;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  const_iterator local_f0;
  string local_e8;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argument_args;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  subcommand_arg;
  bool subcommand_required;
  const_iterator cStack_98;
  bool exclusive;
  const_iterator arg_last;
  const_iterator arg_it;
  undefined1 local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  anon_class_8_1_898fd51e local_48;
  byte local_39;
  code *local_38;
  _func_string_char_ptr *_;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_28;
  argument_order order_local;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *command_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin_local;
  type *opts;
  
  _._4_4_ = (int)command;
  local_38 = detail::widen<std::__cxx11::string>;
  local_39 = 0;
  _Stack_28._M_current = end._M_current;
  command_local =
       (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)begin._M_current;
  end_local._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::option_map(__return_storage_ptr__);
  local_48.opts = __return_storage_ptr__;
  detail::
  tuple_for_each<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_1_>
            (&((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)_Stack_28._M_current)->m_flags,&local_48);
  _Var5 = end_local;
  pbVar1 = command_local;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&arg_it._M_current + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_70,_Var5,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar1,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&arg_it._M_current + 7));
  arg_last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
  cStack_98 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_70);
  subcommand_arg.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = 0;
  subcommand_arg.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._6_1_ = 0;
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&argument_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c8);
  do {
    bVar2 = __gnu_cxx::operator!=(&arg_last,&stack0xffffffffffffff68);
    if (!bVar2) {
LAB_00162e75:
      if ((subcommand_arg.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._7_1_ & 1) == 0) {
        argument_last =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c8);
        local_5b0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c8);
        local_5d0.argument_it = &argument_last;
        local_5d0.argument_last = &local_5b0;
        local_5d0.command =
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)_Stack_28._M_current;
        local_5d0.opts = __return_storage_ptr__;
        detail::
        tuple_for_each<std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_8_>
                  (&((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)_Stack_28._M_current)->m_arguments,&local_5d0);
        bVar2 = __gnu_cxx::operator!=(&argument_last,&local_5b0);
        if (bVar2) {
          auVar10 = __cxa_allocate_exception(0x28);
          pbVar1 = (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)_Stack_28._M_current;
          detail::widen<std::__cxx11::string>
                    (&local_630,(detail *)": unrecognized argument: ",auVar10._8_8_);
          std::operator+(&local_610,&pbVar1->m_header,&local_630);
          __rhs = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&argument_last);
          std::operator+(&local_5f0,&local_610,__rhs);
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(auVar10._0_8_,&local_5f0);
          __cxa_throw(auVar10._0_8_,&basic_error<std::__cxx11::string>::typeinfo,
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
      }
      local_39 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
      std::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&argument_args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_70);
      if ((local_39 & 1) == 0) {
        option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~option_map(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&arg_last);
    detail::widen<std::__cxx11::string>(&local_e8,(detail *)0x19a3b6,s);
    _Var3 = std::operator==(pbVar4,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (_Var3) {
      local_f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_f0,&local_f8);
      _Var5 = std::
              next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (arg_last._M_current,1);
      match._M_begin._M_current =
           (char *)std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                             ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              local_c8,local_f0,_Var5,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )cStack_98._M_current);
      goto LAB_00162e75;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_138);
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&arg_last);
    detail::widen<std::__cxx11::string>
              ((string *)((long)&name.field_2 + 8),(detail *)"--([^=]+)(?:=(.*))?",s_00);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&name.field_2 + 8),0x10);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (pbVar4,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_138,&local_158,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_158);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    if (bVar2) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((string_type *)local_198,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_138,1);
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
      local_1d8.name = (string_type *)local_198;
      local_1d8.exact =
           (bool *)((long)&partial_matches.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      local_1d8.command =
           (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)_Stack_28._M_current;
      local_1d8.partial_matches =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b8;
      detail::
      tuple_for_each<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_2_>
                (&((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)_Stack_28._M_current)->m_flags,&local_1d8);
      if ((partial_matches.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8);
        if (bVar2) {
          local_239 = 1;
          auVar10 = __cxa_allocate_exception(0x28);
          pbVar1 = (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)_Stack_28._M_current;
          detail::widen<std::__cxx11::string>
                    (&local_238,(detail *)": unrecognized option: --",auVar10._8_8_);
          std::operator+(&local_218,&pbVar1->m_header,&local_238);
          std::operator+(&local_1f8,&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198);
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(auVar10._0_8_,&local_1f8);
          local_239 = 0;
          __cxa_throw(auVar10._0_8_,&basic_error<std::__cxx11::string>::typeinfo,
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1b8);
        if (1 < sVar6) {
          std::__cxx11::stringstream::stringstream(local_3c8);
          poVar7 = std::operator<<(local_3b8,(string *)_Stack_28._M_current);
          poVar7 = std::operator<<(poVar7,": ambiguous option: --");
          poVar7 = std::operator<<(poVar7,(string *)local_198);
          std::operator<<(poVar7," [");
          __range7._7_1_ = 1;
          __end0 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8);
          long_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1b8);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&long_name), bVar2) {
            local_3f0 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end0);
            local_3f1 = false;
            bVar2 = std::exchange<bool,bool>((bool *)((long)&__range7 + 7),&local_3f1);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              std::operator<<(local_3b8,", ");
            }
            poVar7 = std::operator<<(local_3b8,"--");
            std::operator<<(poVar7,(string *)local_3f0);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end0);
          }
          std::operator<<(local_3b8,"]");
          local_419 = 1;
          this_01 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringstream::str();
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(this_01,&local_418);
          local_419 = 0;
          __cxa_throw(this_01,&basic_error<std::__cxx11::string>::typeinfo,
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
      }
      local_460.exact =
           (bool *)((long)&partial_matches.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      local_460.name = (string_type *)local_198;
      local_460.match =
           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_138;
      local_460.arg_it = &arg_last;
      local_460.arg_last = &stack0xffffffffffffff68;
      local_460.command =
           (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)_Stack_28._M_current;
      local_460.exclusive =
           (bool *)((long)&subcommand_arg.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7);
      local_460.opts = __return_storage_ptr__;
      detail::
      tuple_for_each<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_3_>
                (&((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)_Stack_28._M_current)->m_flags,&local_460);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      std::__cxx11::string::~string((string *)local_198);
LAB_00162e2d:
      bVar2 = false;
    }
    else {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&arg_last);
      detail::widen<std::__cxx11::string>((string *)&it,(detail *)"-(.+)",s_01);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,0x10);
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (pbVar4,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_138,&local_480,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_480);
      std::__cxx11::string::~string((string *)&it);
      if (bVar2) {
        pvVar8 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_138,1);
        _Stack_4a8._M_current =
             (pvVar8->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).first._M_current;
        while( true ) {
          pvVar8 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_138,1);
          bVar2 = __gnu_cxx::operator!=
                            (&stack0xfffffffffffffb58,
                             &(pvVar8->
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ).second);
          if (!bVar2) break;
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&stack0xfffffffffffffb58);
          local_4a9 = *pcVar9;
          local_4aa = false;
          local_4c8.name = &local_4a9;
          local_4c8.exact = &local_4aa;
          local_4c8.command =
               (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)_Stack_28._M_current;
          detail::
          tuple_for_each<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_4_>
                    (&((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)_Stack_28._M_current)->m_flags,&local_4c8);
          if ((local_4aa & 1U) == 0) {
            local_529 = 1;
            auVar10 = __cxa_allocate_exception(0x28);
            pbVar1 = (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)_Stack_28._M_current;
            detail::widen<std::__cxx11::string>
                      (&local_528,(detail *)": unrecognized option: -",auVar10._8_8_);
            std::operator+(&local_508,&pbVar1->m_header,&local_528);
            std::operator+(&local_4e8,&local_508,local_4a9);
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(auVar10._0_8_,&local_4e8);
            local_529 = 0;
            __cxa_throw(auVar10._0_8_,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          local_570.name = &local_4a9;
          local_570.it = &stack0xfffffffffffffb58;
          local_570.match =
               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_138;
          local_570.arg_it = &arg_last;
          local_570.arg_last = &stack0xffffffffffffff68;
          local_570.command =
               (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)_Stack_28._M_current;
          local_570.exclusive =
               (bool *)((long)&subcommand_arg.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7);
          local_570.opts = __return_storage_ptr__;
          detail::
          tuple_for_each<std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>const&,nonsugar::parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)::_lambda(auto:1_const&)_5_>
                    (&((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)_Stack_28._M_current)->m_flags,&local_570);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&stack0xfffffffffffffb58);
        }
        goto LAB_00162e2d;
      }
      if (_._4_4_ == 1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&arg_last);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c8,pbVar4);
        goto LAB_00162e2d;
      }
      local_580._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_578,&local_580);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c8,
                 local_578,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )arg_last._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )cStack_98._M_current);
      bVar2 = true;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_138);
    if (bVar2) goto LAB_00162e75;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&arg_last);
  } while( true );
}

Assistant:

inline typename detail::to_option_map<Command>::type parse(
    Iterator begin, Iterator end, Command const &command, argument_order order)
{
    using string_type = typename Command::string_type;
    using error_type = basic_error<string_type>;
    using regex_type = std::basic_regex<typename string_type::value_type>;
    auto const &_ = detail::widen<string_type>;

    typename detail::to_option_map<Command>::type opts;
    detail::tuple_for_each(command.m_flags, [&](auto const &flg)
        {
            constexpr auto option = detail::remove_cvr_t<decltype(flg)>::option();
            opts.template priv_value<option>() = flg.default_value;
        });

    std::vector<string_type> const args(begin, end);
    auto arg_it = args.begin();
    auto const arg_last = args.end();
    bool exclusive = false;

    constexpr auto subcommand_required =
        std::tuple_size<typename Command::subcommand_tuple_type>::value != 0;
    std::shared_ptr<string_type> subcommand_arg;
    std::vector<string_type> argument_args;

    for (; arg_it != arg_last; ++arg_it) {
        if (*arg_it == _("--")) {
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        }
        std::match_results<typename string_type::const_iterator> match;
        if (std::regex_match(*arg_it, match, regex_type(_("--([^=]+)(?:=(.*))?")))) {
            // long flag
            auto const name = match.str(1);
            bool exact = false;
            std::vector<string_type> partial_matches;
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    for (auto const &long_name : flg.long_names) {
                        if (name == long_name) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: --") + name);
                            }
                        } else if (detail::starts_with(long_name, name)) {
                            partial_matches.push_back(long_name);
                        }
                    }
                });
            if (!exact) {
                if (partial_matches.empty()) {
                    throw error_type(command.m_header + _(": unrecognized option: --") + name);
                } else if (partial_matches.size() >= 2) {
                    detail::sstream<string_type> ss;
                    ss << command.m_header << ": ambiguous option: --" << name << " [";
                    bool first = true;
                    for (auto const &long_name : partial_matches) {
                        if (!std::exchange(first, false)) ss << ", ";
                        ss << "--" << long_name;
                    }
                    ss << "]";
                    throw error_type(ss.str());
                }
            }
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    using flag_type = detail::remove_cvr_t<decltype(flg)>;
                    using value_type = typename flag_type::value_type;
                    constexpr auto option = flag_type::option();
                    for (auto const &long_name : flg.long_names) {
                        if (exact ? name == long_name : detail::starts_with(long_name, name)) {
                            string_type err;
                            detail::parse_flag_long<string_type, value_type>()(
                                match, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    }
                });
        } else if (std::regex_match(*arg_it, match, regex_type(_("-(.+)")))) {
            // short flag
            for (auto it = match[1].first; it != match[1].second; ++it) {
                auto const name = *it;
                bool exact = false;
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        if (detail::contains(flg.short_names, name)) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: -") + name);
                            }
                        }
                    });
                if (!exact) {
                    throw error_type(command.m_header + _(": unrecognized option: -") + name);
                }
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        using flag_type = detail::remove_cvr_t<decltype(flg)>;
                        using value_type = typename flag_type::value_type;
                        constexpr auto option = flag_type::option();
                        if (detail::contains(flg.short_names, name)) {
                            string_type err;
                            detail::parse_flag_short<string_type, value_type>()(
                                it, match[1].second, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    });
            }
        } else if (subcommand_required && !subcommand_arg) {
            // subcommand and arguments
            subcommand_arg = detail::copy_shared(*arg_it);
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        } else if (order == argument_order::flexible) {
            // argument
            argument_args.push_back(*arg_it);
        } else {
            // arguments
            argument_args.insert(argument_args.end(), arg_it, arg_last);
            break;
        }
    }

    if (exclusive) return opts;

    auto argument_it = argument_args.begin();
    auto const argument_last = argument_args.end();

    if (subcommand_required) {
        if (!subcommand_arg) {
            throw error_type(command.m_header + _(": command required"));
        }
        bool exact = false;
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    if (std::exchange(exact, true)) {
                        throw error_type(
                            command.m_header + _(": ambiguous command: ") + *subcommand_arg);
                    }
                }
            });
        if (!exact) {
            throw error_type(command.m_header + _(": unrecognized command: ") + *subcommand_arg);
        }
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    using subcommand_type = std::remove_cv_t<
                        std::remove_reference_t<decltype(subcmd)>>;
                    constexpr auto option = subcommand_type::option();
                    opts.template priv_value<option>() = detail::copy_shared(
                        parse(argument_it, argument_last, subcmd.command, order));
                }
            });
        return opts;
    }

    detail::tuple_for_each(command.m_arguments, [&](auto const &arg)
        {
            using argument_type = std::remove_cv_t<std::remove_reference_t<decltype(arg)>>;
            using value_type = typename argument_type::value_type;
            constexpr auto option = argument_type::option();
            string_type err;
            detail::parse_argument<string_type, value_type>()(
                argument_it, argument_last, opts.template priv_value<option>(), arg, err);
            if (!err.empty()) {
                throw error_type(command.m_header + _(": ") + err);
            }
        });

    if (argument_it != argument_last) {
        throw error_type(command.m_header + _(": unrecognized argument: ") + *argument_it);
    }

    return opts;
}